

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O2

bool cmForEachCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  size_type *__result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *psVar2;
  int iVar3;
  cmMakefile *pcVar4;
  _Alloc_hider _Var5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  long lVar9;
  string *psVar10;
  pointer pbVar11;
  int iVar12;
  pointer __p;
  int iVar13;
  pointer pbVar14;
  int iVar15;
  string *this_00;
  string_view arg;
  int step;
  int stop;
  cmMakefile *local_118;
  string result;
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_d8;
  string local_d0;
  string local_b0;
  ulong local_90;
  cmMakefile *local_88;
  int start;
  cmAlphaNum local_60;
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar14 == pbVar11) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"called with incorrect number of arguments",
               (allocator<char> *)&local_60);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&result);
LAB_002990c4:
    bVar7 = false;
  }
  else {
    __last = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[3]>>
                       (pbVar14,pbVar11,"IN");
    if (__last._M_current !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      local_118 = status->Makefile;
      result._M_dataplus._M_p = (pointer)local_118;
      std::make_unique<(anonymous_namespace)::cmForEachFunctionBlocker,cmMakefile*>
                ((cmMakefile **)&stop);
      pcVar4 = _stop;
      __result = &(_stop->Targets)._M_h._M_element_count;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,__last._M_current,
                 (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__result);
      lVar9 = *(long *)&(pcVar4->Targets)._M_h._M_rehash_policy -
              (pcVar4->Targets)._M_h._M_element_count;
      local_90 = lVar9 >> 5;
      local_88 = pcVar4;
      *(ulong *)&(pcVar4->AliasTargets)._M_t._M_impl = local_90;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      iVar13 = 0;
      do {
        while( true ) {
          pcVar4 = local_88;
          uVar6 = local_90;
          __last._M_current = __last._M_current + 1;
          if (__last._M_current == pbVar1) {
            if ((1 < local_90 && iVar13 == 3) &&
               (lVar9 >> 4 !=
                (long)(*(long *)&(local_88->Targets)._M_h._M_rehash_policy -
                      (local_88->Targets)._M_h._M_element_count) >> 5)) {
              result._M_dataplus._M_p = &DAT_00000009;
              result._M_string_length = (size_type)anon_var_dwarf_9f2b2c;
              std::__cxx11::to_string(&local_d0,local_90);
              local_60.View_._M_len = local_d0._M_string_length;
              local_60.View_._M_str = local_d0._M_dataplus._M_p;
              std::__cxx11::to_string
                        ((string *)&start,
                         ((long)(*(long *)&(pcVar4->Targets)._M_h._M_rehash_policy -
                                (pcVar4->Targets)._M_h._M_element_count) >> 5) - uVar6);
              cmStrCat<char[28],std::__cxx11::string>
                        (&local_b0,(cmAlphaNum *)&result,&local_60,
                         (char (*) [28])" list variables, but given ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start
                        );
              cmMakefile::IssueMessage(local_118,FATAL_ERROR,&local_b0);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&start);
              psVar10 = &local_d0;
              goto LAB_0029951c;
            }
            _stop = (cmMakefile *)0x0;
            result._M_dataplus._M_p = (pointer)local_88;
            cmMakefile::AddFunctionBlocker
                      (local_118,
                       (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                       &result);
            if (result._M_dataplus._M_p != (pointer)0x0) {
              (**(code **)(*(long *)result._M_dataplus._M_p + 8))();
            }
            result._M_dataplus._M_p = (pointer)0x0;
            goto LAB_00299521;
          }
          bVar7 = std::operator==(__last._M_current,"LISTS");
          if (bVar7) break;
          bVar7 = std::operator==(__last._M_current,"ITEMS");
          if (bVar7) {
            if (iVar13 == 3) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&result,"ZIP_LISTS can not be used with LISTS or ITEMS",
                         (allocator<char> *)&local_60);
              cmMakefile::IssueMessage(local_118,FATAL_ERROR,&result);
              goto LAB_00299517;
            }
            iVar13 = 2;
            if (lVar9 != 0x20) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&result,"ITEMS or LISTS require exactly one iteration variable",
                         (allocator<char> *)&local_60);
              cmMakefile::IssueMessage(local_118,FATAL_ERROR,&result);
              goto LAB_00299517;
            }
          }
          else {
            bVar7 = std::operator==(__last._M_current,"ZIP_LISTS");
            if (bVar7) {
              if (iVar13 != 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&result,"ZIP_LISTS can not be used with LISTS or ITEMS",
                           (allocator<char> *)&local_60);
                cmMakefile::IssueMessage(local_118,FATAL_ERROR,&result);
                goto LAB_00299517;
              }
              *(undefined1 *)
               &(_stop->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_black;
              iVar13 = 3;
            }
            else {
              if (iVar13 == 0) {
                result._M_dataplus._M_p = (pointer)0x12;
                result._M_string_length = (size_type)anon_var_dwarf_9f2af3;
                local_60.View_._M_len = 2;
                local_60.View_._M_str = "  ";
                cmStrCat<std::__cxx11::string,char[2]>
                          (&local_b0,(cmAlphaNum *)&result,&local_60,__last._M_current,
                           (char (*) [2])0x5e8079);
                cmMakefile::IssueMessage(local_118,FATAL_ERROR,&local_b0);
                psVar10 = &local_b0;
                goto LAB_0029951c;
              }
              if (iVar13 == 1) {
                psVar10 = cmMakefile::GetSafeDefinition(local_118,__last._M_current);
                iVar13 = 1;
                if (psVar10->_M_string_length != 0) {
                  arg._M_str = (psVar10->_M_dataplus)._M_p;
                  arg._M_len = psVar10->_M_string_length;
                  cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)__result,true);
                  iVar13 = 1;
                }
              }
              else {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)__result,__last._M_current);
              }
            }
          }
        }
        if (iVar13 == 3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"ZIP_LISTS can not be used with LISTS or ITEMS",
                     (allocator<char> *)&local_60);
          cmMakefile::IssueMessage(local_118,FATAL_ERROR,&result);
          goto LAB_00299517;
        }
        iVar13 = 1;
      } while (lVar9 == 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"ITEMS or LISTS require exactly one iteration variable",
                 (allocator<char> *)&local_60);
      cmMakefile::IssueMessage(local_118,FATAL_ERROR,&result);
LAB_00299517:
      psVar10 = &result;
LAB_0029951c:
      std::__cxx11::string::~string((string *)psVar10);
LAB_00299521:
      if (_stop != (cmMakefile *)0x0) {
        (*(code *)(_stop->FindPackageRootPathStack).
                  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map[1])();
      }
      return true;
    }
    result._M_dataplus._M_p = (pointer)status->Makefile;
    std::make_unique<(anonymous_namespace)::cmForEachFunctionBlocker,cmMakefile*>
              ((cmMakefile **)&local_d0);
    pbVar14 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x21) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_d0._M_dataplus._M_p + 0x98),args);
    }
    else {
      bVar7 = std::operator==(pbVar14 + 1,"RANGE");
      if (bVar7) {
        start = 0;
        _stop = (cmMakefile *)((ulong)_stop & 0xffffffff00000000);
        step = 0;
        pbVar14 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar11 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if ((long)pbVar11 - (long)pbVar14 == 0x60) {
          bVar7 = anon_unknown.dwarf_9fe8c1::TryParseInteger(status,pbVar14 + 2,&stop);
          if (bVar7) {
            pbVar14 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            goto LAB_00299152;
          }
        }
        else {
LAB_00299152:
          if ((long)pbVar11 - (long)pbVar14 == 0x80) {
            bVar7 = anon_unknown.dwarf_9fe8c1::TryParseInteger(status,pbVar14 + 2,&start);
            if ((!bVar7) ||
               (bVar7 = anon_unknown.dwarf_9fe8c1::TryParseInteger
                                  (status,(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + 3,&stop),
               !bVar7)) goto LAB_002995fd;
            pbVar14 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pbVar11 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          }
          if (((long)pbVar11 - (long)pbVar14 != 0xa0) ||
             (((bVar7 = anon_unknown.dwarf_9fe8c1::TryParseInteger(status,pbVar14 + 2,&start), bVar7
               && (bVar7 = anon_unknown.dwarf_9fe8c1::TryParseInteger
                                     (status,(args->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + 3,&stop),
                  bVar7)) &&
              (bVar7 = anon_unknown.dwarf_9fe8c1::TryParseInteger
                                 (status,(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 4,&step),
              bVar7)))) {
            iVar13 = start;
            _Var5._M_p = local_d0._M_dataplus._M_p;
            if (step == 0) {
              if (start <= stop) {
                step = 1;
                goto LAB_00299552;
              }
              step = -1;
              bVar7 = true;
LAB_00299562:
              iVar3 = step;
              if (-1 < step || stop <= start) {
                iVar12 = start - stop;
                iVar8 = -(start - stop);
                if (stop <= start) {
                  iVar8 = 0;
                }
                iVar15 = -step;
                if (0 < step) {
                  iVar15 = step;
                }
                if (!bVar7) {
                  iVar12 = 0;
                }
                this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_d0._M_dataplus._M_p + 0x98);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::resize(this,(ulong)(iVar8 / iVar15 + iVar12 / iVar15 + 2));
                std::__cxx11::string::_M_assign
                          ((string *)
                           (this->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
                this_00 = *(string **)(_Var5._M_p + 0x98);
                psVar2 = *(string **)(_Var5._M_p + 0xa0);
                while (this_00 = this_00 + 0x20, this_00 != psVar2) {
                  std::__cxx11::to_string(&result,iVar13);
                  iVar13 = iVar13 + iVar3;
                  std::__cxx11::string::operator=(this_00,(string *)&result);
                  std::__cxx11::string::~string((string *)&result);
                }
                goto LAB_0029933b;
              }
            }
            else {
LAB_00299552:
              bVar7 = stop < start;
              if (!bVar7 || step < 1) goto LAB_00299562;
            }
            result._M_dataplus._M_p = (pointer)0x31;
            result._M_string_length = (size_type)anon_var_dwarf_9f2a2c;
            cmAlphaNum::cmAlphaNum(&local_60,start);
            cmStrCat<char[8],int,char[8],int>
                      (&local_b0,(cmAlphaNum *)&result,&local_60,(char (*) [8])", stop ",&stop,
                       (char (*) [8])", step ",&step);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            std::__cxx11::string::~string((string *)&local_b0);
            cmSystemTools::s_FatalErrorOccurred = true;
          }
        }
LAB_002995fd:
        if ((long *)local_d0._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_d0._M_dataplus._M_p + 8))();
        }
        goto LAB_002990c4;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_d0._M_dataplus._M_p + 0x98),args);
    }
LAB_0029933b:
    *(long *)((long)local_d0._M_dataplus._M_p + 0xb8) = 1;
    local_d8._M_t.
    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
    super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         local_d0._M_dataplus._M_p;
    cmMakefile::AddFunctionBlocker
              (status->Makefile,
               (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)&local_d8);
    bVar7 = true;
    if ((_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
        local_d8._M_t.
        super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
        super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl != (cmFunctionBlocker *)0x0)
    {
      (**(code **)(*(long *)local_d8._M_t.
                            super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))();
    }
  }
  return bVar7;
}

Assistant:

bool cmForEachCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  auto kwInIter = std::find(args.begin(), args.end(), "IN");
  if (kwInIter != args.end()) {
    return HandleInMode(args, kwInIter, status.GetMakefile());
  }

  // create a function blocker
  auto fb = cm::make_unique<cmForEachFunctionBlocker>(&status.GetMakefile());
  if (args.size() > 1) {
    if (args[1] == "RANGE") {
      int start = 0;
      int stop = 0;
      int step = 0;
      if (args.size() == 3) {
        if (!TryParseInteger(status, args[2], stop)) {
          return false;
        }
      }
      if (args.size() == 4) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
      }
      if (args.size() == 5) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
        if (!TryParseInteger(status, args[4], step)) {
          return false;
        }
      }
      if (step == 0) {
        if (start > stop) {
          step = -1;
        } else {
          step = 1;
        }
      }
      if ((start > stop && step > 0) || (start < stop && step < 0) ||
          step == 0) {
        status.SetError(
          cmStrCat("called with incorrect range specification: start ", start,
                   ", stop ", stop, ", step ", step));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      }

      // Calculate expected iterations count and reserve enough space
      // in the `fb->Args` vector. The first item is the iteration variable
      // name...
      const std::size_t iter_cnt = 2u +
        static_cast<int>(start < stop) * (stop - start) / std::abs(step) +
        static_cast<int>(start > stop) * (start - stop) / std::abs(step);
      fb->Args.resize(iter_cnt);
      fb->Args.front() = args.front();
      auto cc = start;
      auto generator = [&cc, step]() -> std::string {
        auto result = std::to_string(cc);
        cc += step;
        return result;
      };
      // Fill the `range` vector w/ generated string values
      // (starting from 2nd position)
      std::generate(++fb->Args.begin(), fb->Args.end(), generator);
    } else {
      fb->Args = args;
    }
  } else {
    fb->Args = args;
  }

  fb->SetIterationVarsCount(1u);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}